

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O2

void flatbuffers::tests::ParseProtoBufAsciiTest(void)

{
  bool bVar1;
  uint8_t *flatbuffer;
  char *pcVar2;
  string text;
  Parser parser;
  
  IDLOptions::IDLOptions((IDLOptions *)&text);
  Parser::Parser(&parser,(IDLOptions *)&text);
  IDLOptions::~IDLOptions((IDLOptions *)&text);
  parser.opts.protobuf_ascii_alike = true;
  bVar1 = Parser::Parse(&parser,"table S { B:int; } table T { A:[int]; C:S; } root_type T;",
                        (char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser.Parse(\"table S { B:int; } table T { A:[int]; C:S; } root_type T;\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
                    ,0x143,"");
  bVar1 = Parser::Parse(&parser,"{ A [1 2] C { B:2 }}",(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parser.Parse(\"{ A [1 2] C { B:2 }}\")\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
                    ,0x144,"");
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer(&parser.builder_);
  pcVar2 = GenText(&parser,flatbuffer,&text);
  TestEq<bool,bool>(true,pcVar2 == (char *)0x0,"\'nullptr\' != \'err\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
                    ,0x14a,"");
  TestEqStr(text._M_dataplus._M_p,"{\n  A [\n    1\n    2\n  ]\n  C {\n    B: 2\n  }\n}\n",
            "\'text.c_str()\' != \'\"{\\n  A [\\n    1\\n    2\\n  ]\\n  C {\\n    B: 2\\n  }\\n}\\n\"\'"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
            ,0x14c,"");
  std::__cxx11::string::~string((string *)&text);
  Parser::~Parser(&parser);
  return;
}

Assistant:

void ParseProtoBufAsciiTest() {
  // We can put the parser in a mode where it will accept JSON that looks more
  // like Protobuf ASCII, for users that have data in that format.
  // This uses no "" for field names (which we already support by default,
  // omits `,`, `:` before `{` and a couple of other features.
  flatbuffers::Parser parser;
  parser.opts.protobuf_ascii_alike = true;
  TEST_EQ(
      parser.Parse("table S { B:int; } table T { A:[int]; C:S; } root_type T;"),
      true);
  TEST_EQ(parser.Parse("{ A [1 2] C { B:2 }}"), true);
  // Similarly, in text output, it should omit these.
  std::string text;
  auto err =
      flatbuffers::GenText(
      parser, parser.builder_.GetBufferPointer(), &text);
  TEST_NULL(err);
  TEST_EQ_STR(text.c_str(),
              "{\n  A [\n    1\n    2\n  ]\n  C {\n    B: 2\n  }\n}\n");
}